

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_false>::swap
          (DaTrie<false,_true,_false> *this,DaTrie<false,_true,_false> *rhs)

{
  long in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  vector<char,_std::allocator<char>_> *__x;
  
  __x = in_RDI;
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::swap
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)unaff_retaddr,
             (vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI);
  std::vector<char,_std::allocator<char>_>::swap(unaff_retaddr,__x);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::swap
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)unaff_retaddr,
             (vector<ddd::Block,_std::allocator<ddd::Block>_> *)__x);
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::swap
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)unaff_retaddr,
             (vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)__x);
  std::swap<unsigned_int>((uint *)(in_RDI + 4),(uint *)(in_RSI + 0x60));
  std::swap<unsigned_int>
            ((uint *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x4,
             (uint *)(in_RSI + 100));
  std::swap<unsigned_int>
            ((uint *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8,
             (uint *)(in_RSI + 0x68));
  return;
}

Assistant:

void swap(DaTrie& rhs) {
    bc_.swap(rhs.bc_);
    tail_.swap(rhs.tail_);
    blocks_.swap(rhs.blocks_);
    node_links_.swap(rhs.node_links_);
    std::swap(head_pos_, rhs.head_pos_);
    std::swap(bc_emps_, rhs.bc_emps_);
    std::swap(tail_emps_, rhs.tail_emps_);
  }